

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

void __thiscall
ghc::filesystem::path::path<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (path *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                last,format fmt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  pointer pcVar3;
  ulong uVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  undefined4 in_register_0000000c;
  uint *local_40;
  ulong local_38;
  uint local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  local_40 = &local_30;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_40,first._M_current,last._M_current,CONCAT44(in_register_0000000c,fmt)
            );
  uVar4 = local_38;
  paVar1 = &(this->_path).field_2;
  (this->_path)._M_dataplus._M_p = (pointer)paVar1;
  if (local_40 == &local_30) {
    *(uint *)paVar1 = local_30;
    *(undefined4 *)((long)&(this->_path).field_2 + 4) = uStack_2c;
    *(undefined4 *)((long)&(this->_path).field_2 + 8) = uStack_28;
    *(undefined4 *)((long)&(this->_path).field_2 + 0xc) = uStack_24;
  }
  else {
    (this->_path)._M_dataplus._M_p = (pointer)local_40;
    (this->_path).field_2._M_allocated_capacity = CONCAT44(uStack_2c,local_30);
  }
  (this->_path)._M_string_length = local_38;
  local_38 = 0;
  local_30 = local_30 & 0xffffff00;
  if ((((uVar4 < 3) || (pcVar2 = (this->_path)._M_dataplus._M_p, *pcVar2 != '/')) ||
      (pcVar2[1] != '/')) || (pcVar2[2] == '/')) {
    pcVar3 = (this->_path)._M_dataplus._M_p;
    local_40 = &local_30;
    _Var5 = std::
            __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_2_>>
                      (pcVar3,pcVar3 + uVar4);
  }
  else {
    local_40 = &local_30;
    _Var5 = std::
            __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_1_>>
                      (pcVar2 + 2,pcVar2 + uVar4);
  }
  (this->_path)._M_string_length = (long)_Var5._M_current - (long)(this->_path)._M_dataplus._M_p;
  *_Var5._M_current = '\0';
  if (local_40 != &local_30) {
    operator_delete(local_40);
  }
  return;
}

Assistant:

inline path::path(InputIterator first, InputIterator last, format fmt)
    : path(std::basic_string<typename std::iterator_traits<InputIterator>::value_type>(first, last), fmt)
{
    // delegated
}